

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3_optional.pb.cc
# Opt level: O1

void proto2_unittest::TestProto3Optional::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  MessageLite *pMVar4;
  MessageLite *to_msg_00;
  _func_int **pp_Var5;
  void *pvVar6;
  Nonnull<const_char_*> pcVar7;
  Arena *pAVar8;
  Arena *arena;
  
  arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  if (from_msg == to_msg) {
    pcVar7 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                       (from_msg,to_msg,"&from != _this");
  }
  else {
    pcVar7 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar7 != (Nonnull<const_char_*>)0x0) goto LAB_00d2d299;
  uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
  if ((char)uVar1 == '\0') goto LAB_00d2d11c;
  if ((uVar1 & 1) != 0) {
    uVar3 = from_msg[1]._internal_metadata_.ptr_;
    *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 1;
    pAVar8 = (Arena *)(to_msg->_internal_metadata_).ptr_;
    if (((ulong)pAVar8 & 1) != 0) {
      pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
    }
    google::protobuf::internal::ArenaStringPtr::Set<>
              ((ArenaStringPtr *)&to_msg[1]._internal_metadata_,
               (string *)(uVar3 & 0xfffffffffffffffc),pAVar8);
  }
  if ((uVar1 & 2) != 0) {
    pp_Var5 = from_msg[2]._vptr_MessageLite;
    *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 2;
    pAVar8 = (Arena *)(to_msg->_internal_metadata_).ptr_;
    if (((ulong)pAVar8 & 1) != 0) {
      pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
    }
    google::protobuf::internal::ArenaStringPtr::Set<>
              ((ArenaStringPtr *)(to_msg + 2),(string *)((ulong)pp_Var5 & 0xfffffffffffffffc),pAVar8
              );
  }
  if ((uVar1 & 4) != 0) {
    uVar3 = from_msg[2]._internal_metadata_.ptr_;
    *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 4;
    pAVar8 = (Arena *)(to_msg->_internal_metadata_).ptr_;
    if (((ulong)pAVar8 & 1) != 0) {
      pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
    }
    google::protobuf::internal::ArenaStringPtr::Set<>
              ((ArenaStringPtr *)&to_msg[2]._internal_metadata_,
               (string *)(uVar3 & 0xfffffffffffffffc),pAVar8);
  }
  if ((uVar1 & 8) != 0) {
    pMVar4 = (MessageLite *)from_msg[3]._vptr_MessageLite;
    if (pMVar4 != (MessageLite *)0x0) {
      if ((MessageLite *)to_msg[3]._vptr_MessageLite == (MessageLite *)0x0) {
        pp_Var5 = (_func_int **)
                  google::protobuf::Arena::
                  CopyConstruct<proto2_unittest::TestProto3Optional_NestedMessage>(arena,pMVar4);
        to_msg[3]._vptr_MessageLite = pp_Var5;
      }
      else {
        TestProto3Optional_NestedMessage::MergeImpl
                  ((MessageLite *)to_msg[3]._vptr_MessageLite,pMVar4);
      }
      goto LAB_00d2d0c6;
    }
    MergeImpl((TestProto3Optional *)&stack0xffffffffffffffd0);
LAB_00d2d28f:
    MergeImpl((TestProto3Optional *)&stack0xffffffffffffffd0);
LAB_00d2d299:
    MergeImpl();
  }
LAB_00d2d0c6:
  if ((uVar1 & 0x10) != 0) {
    pMVar4 = (MessageLite *)from_msg[3]._internal_metadata_.ptr_;
    if (pMVar4 == (MessageLite *)0x0) goto LAB_00d2d28f;
    to_msg_00 = (MessageLite *)to_msg[3]._internal_metadata_.ptr_;
    if (to_msg_00 == (MessageLite *)0x0) {
      pvVar6 = google::protobuf::Arena::
               CopyConstruct<proto2_unittest::TestProto3Optional_NestedMessage>(arena,pMVar4);
      to_msg[3]._internal_metadata_.ptr_ = (intptr_t)pvVar6;
    }
    else {
      TestProto3Optional_NestedMessage::MergeImpl(to_msg_00,pMVar4);
    }
  }
  if ((uVar1 & 0x20) != 0) {
    to_msg[4]._vptr_MessageLite = from_msg[4]._vptr_MessageLite;
  }
  if ((uVar1 & 0x40) != 0) {
    *(int *)&to_msg[4]._internal_metadata_.ptr_ = (int)from_msg[4]._internal_metadata_.ptr_;
  }
  if ((char)uVar1 < '\0') {
    *(undefined4 *)((long)&to_msg[4]._internal_metadata_.ptr_ + 4) =
         *(undefined4 *)((long)&from_msg[4]._internal_metadata_.ptr_ + 4);
  }
LAB_00d2d11c:
  if ((uVar1 & 0xff00) != 0) {
    if ((uVar1 >> 8 & 1) != 0) {
      to_msg[5]._vptr_MessageLite = from_msg[5]._vptr_MessageLite;
    }
    if ((uVar1 >> 9 & 1) != 0) {
      to_msg[5]._internal_metadata_.ptr_ = from_msg[5]._internal_metadata_.ptr_;
    }
    if ((uVar1 >> 10 & 1) != 0) {
      *(undefined4 *)&to_msg[6]._vptr_MessageLite = *(undefined4 *)&from_msg[6]._vptr_MessageLite;
    }
    if ((uVar1 >> 0xb & 1) != 0) {
      *(undefined4 *)((long)&to_msg[6]._vptr_MessageLite + 4) =
           *(undefined4 *)((long)&from_msg[6]._vptr_MessageLite + 4);
    }
    if ((uVar1 >> 0xc & 1) != 0) {
      to_msg[6]._internal_metadata_.ptr_ = from_msg[6]._internal_metadata_.ptr_;
    }
    if ((uVar1 >> 0xd & 1) != 0) {
      to_msg[7]._vptr_MessageLite = from_msg[7]._vptr_MessageLite;
    }
    if ((uVar1 >> 0xe & 1) != 0) {
      *(int *)&to_msg[7]._internal_metadata_.ptr_ = (int)from_msg[7]._internal_metadata_.ptr_;
    }
    if ((short)uVar1 < 0) {
      *(undefined4 *)((long)&to_msg[7]._internal_metadata_.ptr_ + 4) =
           *(undefined4 *)((long)&from_msg[7]._internal_metadata_.ptr_ + 4);
    }
  }
  if ((uVar1 & 0x1f0000) != 0) {
    if ((uVar1 >> 0x10 & 1) != 0) {
      to_msg[8]._vptr_MessageLite = from_msg[8]._vptr_MessageLite;
    }
    if ((uVar1 >> 0x11 & 1) != 0) {
      *(char *)&to_msg[8]._internal_metadata_.ptr_ = (char)from_msg[8]._internal_metadata_.ptr_;
    }
    if ((uVar1 >> 0x12 & 1) != 0) {
      *(undefined4 *)((long)&to_msg[8]._internal_metadata_.ptr_ + 4) =
           *(undefined4 *)((long)&from_msg[8]._internal_metadata_.ptr_ + 4);
    }
    if (((uVar1 >> 0x13 & 1) != 0) && (from_msg[9]._vptr_MessageLite != (_func_int **)0x0)) {
      to_msg[9]._vptr_MessageLite = from_msg[9]._vptr_MessageLite;
    }
    if (((uVar1 >> 0x14 & 1) != 0) &&
       (iVar2 = (int)from_msg[9]._internal_metadata_.ptr_, iVar2 != 0)) {
      *(int *)&to_msg[9]._internal_metadata_.ptr_ = iVar2;
    }
  }
  *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | uVar1;
  uVar3 = (from_msg->_internal_metadata_).ptr_;
  if ((uVar3 & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
            (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar3 & 0xfffffffffffffffe) + 8));
  return;
}

Assistant:

void TestProto3Optional::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestProto3Optional*>(&to_msg);
  auto& from = static_cast<const TestProto3Optional&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.TestProto3Optional)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_optional_string(from._internal_optional_string());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_internal_set_optional_bytes(from._internal_optional_bytes());
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_internal_set_optional_cord(from._internal_optional_cord());
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      ABSL_DCHECK(from._impl_.optional_nested_message_ != nullptr);
      if (_this->_impl_.optional_nested_message_ == nullptr) {
        _this->_impl_.optional_nested_message_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.optional_nested_message_);
      } else {
        _this->_impl_.optional_nested_message_->MergeFrom(*from._impl_.optional_nested_message_);
      }
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      ABSL_DCHECK(from._impl_.lazy_nested_message_ != nullptr);
      if (_this->_impl_.lazy_nested_message_ == nullptr) {
        _this->_impl_.lazy_nested_message_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.lazy_nested_message_);
      } else {
        _this->_impl_.lazy_nested_message_->MergeFrom(*from._impl_.lazy_nested_message_);
      }
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      _this->_impl_.optional_int64_ = from._impl_.optional_int64_;
    }
    if ((cached_has_bits & 0x00000040u) != 0) {
      _this->_impl_.optional_int32_ = from._impl_.optional_int32_;
    }
    if ((cached_has_bits & 0x00000080u) != 0) {
      _this->_impl_.optional_uint32_ = from._impl_.optional_uint32_;
    }
  }
  if ((cached_has_bits & 0x0000ff00u) != 0) {
    if ((cached_has_bits & 0x00000100u) != 0) {
      _this->_impl_.optional_uint64_ = from._impl_.optional_uint64_;
    }
    if ((cached_has_bits & 0x00000200u) != 0) {
      _this->_impl_.optional_sint64_ = from._impl_.optional_sint64_;
    }
    if ((cached_has_bits & 0x00000400u) != 0) {
      _this->_impl_.optional_sint32_ = from._impl_.optional_sint32_;
    }
    if ((cached_has_bits & 0x00000800u) != 0) {
      _this->_impl_.optional_fixed32_ = from._impl_.optional_fixed32_;
    }
    if ((cached_has_bits & 0x00001000u) != 0) {
      _this->_impl_.optional_fixed64_ = from._impl_.optional_fixed64_;
    }
    if ((cached_has_bits & 0x00002000u) != 0) {
      _this->_impl_.optional_sfixed64_ = from._impl_.optional_sfixed64_;
    }
    if ((cached_has_bits & 0x00004000u) != 0) {
      _this->_impl_.optional_sfixed32_ = from._impl_.optional_sfixed32_;
    }
    if ((cached_has_bits & 0x00008000u) != 0) {
      _this->_impl_.optional_float_ = from._impl_.optional_float_;
    }
  }
  if ((cached_has_bits & 0x001f0000u) != 0) {
    if ((cached_has_bits & 0x00010000u) != 0) {
      _this->_impl_.optional_double_ = from._impl_.optional_double_;
    }
    if ((cached_has_bits & 0x00020000u) != 0) {
      _this->_impl_.optional_bool_ = from._impl_.optional_bool_;
    }
    if ((cached_has_bits & 0x00040000u) != 0) {
      _this->_impl_.optional_nested_enum_ = from._impl_.optional_nested_enum_;
    }
    if ((cached_has_bits & 0x00080000u) != 0) {
      if (from._internal_singular_int64() != 0) {
        _this->_impl_.singular_int64_ = from._impl_.singular_int64_;
      }
    }
    if ((cached_has_bits & 0x00100000u) != 0) {
      if (from._internal_singular_int32() != 0) {
        _this->_impl_.singular_int32_ = from._impl_.singular_int32_;
      }
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}